

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LSM_tree.cpp
# Opt level: O0

bool __thiscall LSM_tree::find(LSM_tree *this,uint64_t key)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  reference ppLVar5;
  reference ppSVar6;
  int local_d4;
  undefined1 local_d0 [3];
  bool is_find;
  int id;
  pairs temp;
  Sstable sstable;
  undefined1 local_90 [4];
  int j;
  Level level;
  int i;
  bool ans_del;
  uint ans_timer;
  bool has;
  bool local_41;
  undefined1 local_40 [6];
  bool has_key;
  bool del;
  string result;
  uint64_t key_local;
  LSM_tree *this_local;
  
  result.field_2._8_8_ = key;
  std::__cxx11::string::string((string *)local_40);
  local_41 = false;
  bVar1 = Skiplist::has_key(&this->memtable,result.field_2._8_8_,&local_41,(string *)local_40);
  if (bVar1) {
    if ((local_41 & 1U) == 0) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    bVar1 = false;
    i = 0;
    level.file.super__Vector_base<Sstable_*,_std::allocator<Sstable_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    for (level.file.super__Vector_base<Sstable_*,_std::allocator<Sstable_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        uVar3 = (ulong)(int)level.file.super__Vector_base<Sstable_*,_std::allocator<Sstable_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
        sVar4 = std::vector<Level_*,_std::allocator<Level_*>_>::size(&this->disk), uVar3 < sVar4;
        level.file.super__Vector_base<Sstable_*,_std::allocator<Sstable_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             (int)level.file.super__Vector_base<Sstable_*,_std::allocator<Sstable_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 1) {
      sVar4 = std::vector<Level_*,_std::allocator<Level_*>_>::size(&this->disk);
      if (sVar4 == 0) {
        this_local._7_1_ = false;
        goto LAB_0010859b;
      }
      ppLVar5 = std::vector<Level_*,_std::allocator<Level_*>_>::operator[]
                          (&this->disk,
                           (long)(int)level.file.
                                      super__Vector_base<Sstable_*,_std::allocator<Sstable_*>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      Level::Level((Level *)local_90,*ppLVar5);
      for (sstable.buffer.super__Vector_base<pairs_*,_std::allocator<pairs_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          sVar4 = std::vector<Sstable_*,_std::allocator<Sstable_*>_>::size
                            ((vector<Sstable_*,_std::allocator<Sstable_*>_> *)&level.is_creat),
          (ulong)(long)sstable.buffer.super__Vector_base<pairs_*,_std::allocator<pairs_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_ < sVar4;
          sstable.buffer.super__Vector_base<pairs_*,_std::allocator<pairs_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               sstable.buffer.super__Vector_base<pairs_*,_std::allocator<pairs_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        ppSVar6 = std::vector<Sstable_*,_std::allocator<Sstable_*>_>::operator[]
                            ((vector<Sstable_*,_std::allocator<Sstable_*>_> *)&level.is_creat,
                             (long)sstable.buffer.
                                   super__Vector_base<pairs_*,_std::allocator<pairs_*>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage._4_4_);
        if (*ppSVar6 != (value_type)0x0) {
          ppSVar6 = std::vector<Sstable_*,_std::allocator<Sstable_*>_>::operator[]
                              ((vector<Sstable_*,_std::allocator<Sstable_*>_> *)&level.is_creat,
                               (long)sstable.buffer.
                                     super__Vector_base<pairs_*,_std::allocator<pairs_*>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage._4_4_);
          Sstable::Sstable((Sstable *)&temp.del,*ppSVar6);
          pairs::pairs((pairs *)local_d0,0,0,0,false);
          local_d4 = 0;
          bVar2 = Sstable::find((Sstable *)&temp.del,result.field_2._8_8_,(pairs *)local_d0,
                                &local_d4);
          if ((bVar2) && (bVar1 = true, (uint)i < temp.key._4_4_)) {
            i = temp.key._4_4_;
            level.file.super__Vector_base<Sstable_*,_std::allocator<Sstable_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._7_1_ = (byte)temp.offset & 1;
          }
          Sstable::~Sstable((Sstable *)&temp.del);
        }
      }
      Level::~Level((Level *)local_90);
    }
    if (bVar1) {
      if ((level.file.super__Vector_base<Sstable_*,_std::allocator<Sstable_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
LAB_0010859b:
  std::__cxx11::string::~string((string *)local_40);
  return this_local._7_1_;
}

Assistant:

bool LSM_tree::find(uint64_t key) {
    //-----------------------------------先去memtable里找--------------------------//

    //声明：如果memtable里存了一个标记被删了的pair 那么memtable.get是会返回NULL的 也就是没找到
//    if ((memtable.get(key)) != nullptr) {
//        return true;
//    }
    std::string result;
//    if ((result = memtable.get(key)) != nullptr) {
//        return *result;
//    }
    bool del = false;
    bool has_key = memtable.has_key(key, del, result);
    if (has_key) {
        if (del) {
            return false;
        } else
            return true;
    }

    bool has = false;
    unsigned int ans_timer = 0;
    bool ans_del = false;
    for (int i = 0; i < disk.size(); i++) {

        if (disk.size() == 0) return false;
        //每层里 一个文件一个文件找 -----在索引里
        Level level = *disk[i];
        for (int j = 0; j < level.file.size(); j++) {
            if (level.file[j] == nullptr) continue;
            Sstable sstable = *(level.file[j]);

            pairs temp(0, 0, 0, false);

            //标记为删了的不能返回true哦！
            int id = 0;

            bool is_find = sstable.find(key, temp, id);

            if (is_find) {
                has = true;
                if (temp.timer > ans_timer) {
                    ans_timer = temp.timer;
                    ans_del = temp.del;

                }

            }

        }
    }

    if (!has) {
        return false;
    } else {
        if (ans_del) return false;
        return true;

    }


}